

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<int,_bool>::streamReconstructedExpression(BinaryExpr<int,_bool> *this,ostream *os)

{
  int in_EDX;
  string *in_R9;
  StringRef op;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined2 uStack_3a;
  string local_30;
  
  StringMaker<int,void>::convert_abi_cxx11_
            (&local_30,
             (StringMaker<int,void> *)(ulong)*(uint *)&(this->super_ITransientExpression).field_0xc,
             in_EDX);
  if (this->m_rhs == true) {
    local_40 = 0x65757274;
    local_48 = 4;
    uStack_3c = 0;
  }
  else {
    uStack_3c = 0x65;
    local_40 = 0x736c6166;
    local_48 = 5;
    uStack_3b = 0;
  }
  op.m_size = (size_type)&local_50;
  op.m_start = (char *)(this->m_op).m_size;
  local_50 = &local_40;
  formatReconstructedExpression
            ((Catch *)os,(ostream *)&local_30,(string *)(this->m_op).m_start,op,in_R9);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT26(uStack_3a,CONCAT15(uStack_3b,CONCAT14(uStack_3c,local_40))) +
                             1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }